

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O0

void deqp::egl::Image::checkCallReturn<void*>
               (EglTestContext *eglTestCtx,char *call,void *returnValue,void *expectReturnValue,
               EGLint expectError)

{
  qpTestResult qVar1;
  MessageBuilder *pMVar2;
  Library *pLVar3;
  Enum<int,_2UL> EVar4;
  Enum<int,_2UL> local_508;
  GetNameFunc local_4f8;
  int local_4f0;
  Enum<int,_2UL> local_4e8;
  MessageBuilder local_4d8;
  MessageBuilder local_358;
  MessageBuilder local_1c8;
  int local_44;
  TestLog *pTStack_40;
  EGLint error;
  TestLog *log;
  TestContext *testCtx;
  void *pvStack_28;
  EGLint expectError_local;
  void *expectReturnValue_local;
  void *returnValue_local;
  char *call_local;
  EglTestContext *eglTestCtx_local;
  
  testCtx._4_4_ = expectError;
  pvStack_28 = expectReturnValue;
  expectReturnValue_local = returnValue;
  returnValue_local = call;
  call_local = (char *)eglTestCtx;
  log = (TestLog *)EglTestContext::getTestContext(eglTestCtx);
  pTStack_40 = tcu::TestContext::getLog((TestContext *)log);
  tcu::TestLog::operator<<(&local_1c8,pTStack_40,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1c8,(char **)&returnValue_local);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c8);
  pLVar3 = EglTestContext::getLibrary((EglTestContext *)call_local);
  local_44 = (*pLVar3->_vptr_Library[0x1f])();
  if (expectReturnValue_local != pvStack_28) {
    tcu::TestLog::operator<<(&local_358,pTStack_40,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_358,(char (*) [41])"  Fail: Return value mismatch! Expected ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&stack0xffffffffffffffd8);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [7])0x2c67b94);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&expectReturnValue_local);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_358);
    qVar1 = tcu::TestContext::getTestResult((TestContext *)log);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult((TestContext *)log,QP_TEST_RESULT_FAIL,"Invalid return value")
      ;
    }
  }
  if (local_44 != testCtx._4_4_) {
    tcu::TestLog::operator<<(&local_4d8,pTStack_40,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_4d8,(char (*) [39])"  Fail: Error code mismatch! Expected ");
    EVar4 = eglu::getErrorStr(testCtx._4_4_);
    local_4f8 = EVar4.m_getName;
    local_4f0 = EVar4.m_value;
    local_4e8.m_getName = local_4f8;
    local_4e8.m_value = local_4f0;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_4e8);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [7])0x2c67b94);
    EVar4 = eglu::getErrorStr(local_44);
    local_508.m_getName = EVar4.m_getName;
    local_508.m_value = EVar4.m_value;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_508);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4d8);
    qVar1 = tcu::TestContext::getTestResult((TestContext *)log);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult((TestContext *)log,QP_TEST_RESULT_FAIL,"Invalid error code");
    }
  }
  return;
}

Assistant:

void checkCallReturn (EglTestContext& eglTestCtx, const char* call, RetVal returnValue, RetVal expectReturnValue, EGLint expectError)
{
	tcu::TestContext&	testCtx		= eglTestCtx.getTestContext();
	TestLog&			log			= testCtx.getLog();
	EGLint				error;

	log << TestLog::Message << call << TestLog::EndMessage;

	error = eglTestCtx.getLibrary().getError();

	if (returnValue != expectReturnValue)
	{
		log << TestLog::Message << "  Fail: Return value mismatch! Expected " << expectReturnValue << ", got " << returnValue << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid return value");
	}

	if (error != expectError)
	{
		log << TestLog::Message << "  Fail: Error code mismatch! Expected " << eglu::getErrorStr(expectError) << ", got " << eglu::getErrorStr(error) << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid error code");
	}
}